

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O3

int __thiscall ncnn::Convolution::create_pipeline(Convolution *this,Option *opt)

{
  int *piVar1;
  void *__ptr;
  Allocator *pAVar2;
  ulong uVar3;
  bool bVar4;
  int _w;
  Option opt_q;
  Mat local_140;
  Mat local_f8;
  Mat local_b0;
  Option local_68;
  
  if ((((this->dynamic_weight == 0) && (opt->use_int8_inference == true)) &&
      ((this->weight_data).elemsize == 4)) && (this->int8_scale_term != 0)) {
    _w = this->kernel_h * this->kernel_w;
    uVar3 = (long)this->weight_data_size / (long)this->num_output;
    Mat::reshape(&local_b0,&this->weight_data,_w,
                 (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
                      (long)_w),this->num_output,(Allocator *)0x0);
    local_f8.cstep = 0;
    local_f8.data = (void *)0x0;
    local_f8.refcount._0_4_ = 0;
    local_f8.refcount._4_4_ = 0;
    local_f8.elemsize._0_4_ = 0;
    local_f8._20_8_ = 0;
    local_f8.allocator = (Allocator *)0x0;
    local_f8.dims = 0;
    local_f8.w = 0;
    local_f8.h = 0;
    local_f8.d = 0;
    local_f8.c = 0;
    local_68.lightmode = opt->lightmode;
    local_68._1_3_ = *(undefined3 *)&opt->field_0x1;
    local_68.num_threads = opt->num_threads;
    local_68.workspace_allocator = opt->workspace_allocator;
    local_68.openmp_blocktime = opt->openmp_blocktime;
    local_68.use_winograd_convolution = opt->use_winograd_convolution;
    local_68.use_sgemm_convolution = opt->use_sgemm_convolution;
    local_68.use_int8_inference = opt->use_int8_inference;
    local_68.use_vulkan_compute = opt->use_vulkan_compute;
    uVar3._0_1_ = opt->use_bf16_storage;
    uVar3._1_1_ = opt->use_fp16_packed;
    uVar3._2_1_ = opt->use_fp16_storage;
    uVar3._3_1_ = opt->use_fp16_arithmetic;
    uVar3._4_1_ = opt->use_int8_packed;
    uVar3._5_1_ = opt->use_int8_storage;
    uVar3._6_1_ = opt->use_int8_arithmetic;
    uVar3._7_1_ = opt->use_packing_layout;
    local_68.use_shader_pack8 = opt->use_shader_pack8;
    local_68.use_subgroup_basic = opt->use_subgroup_basic;
    local_68.use_subgroup_vote = opt->use_subgroup_vote;
    local_68.use_subgroup_ballot = opt->use_subgroup_ballot;
    local_68.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    local_68.use_image_storage = opt->use_image_storage;
    local_68.use_tensor_storage = opt->use_tensor_storage;
    local_68.use_reserved_0 = opt->use_reserved_0;
    local_68.flush_denormals = opt->flush_denormals;
    local_68.use_local_pool_allocator = opt->use_local_pool_allocator;
    local_68.use_shader_local_memory = opt->use_shader_local_memory;
    local_68.use_cooperative_matrix = opt->use_cooperative_matrix;
    local_68.use_winograd23_convolution = opt->use_winograd23_convolution;
    local_68.use_winograd43_convolution = opt->use_winograd43_convolution;
    local_68.use_winograd63_convolution = opt->use_winograd63_convolution;
    local_68.use_reserved_6 = opt->use_reserved_6;
    local_68.use_reserved_7 = opt->use_reserved_7;
    local_68.use_reserved_8 = opt->use_reserved_8;
    local_68.use_reserved_9 = opt->use_reserved_9;
    local_68.use_reserved_10 = opt->use_reserved_10;
    local_68.use_reserved_11 = opt->use_reserved_11;
    local_68.blob_allocator = (this->weight_data).allocator;
    local_68._32_8_ = uVar3 & 0xffffffffffffff;
    quantize_to_int8(&local_b0,&local_f8,&this->weight_data_int8_scales,&local_68);
    if ((local_f8.data == (void *)0x0) || ((long)local_f8.c * local_f8.cstep == 0)) {
      bVar4 = false;
    }
    else {
      Mat::reshape(&local_140,&local_f8,this->weight_data_size,(Allocator *)0x0);
      if (&this->weight_data != &local_140) {
        if (local_140.refcount != (int *)0x0) {
          LOCK();
          *local_140.refcount = *local_140.refcount + 1;
          UNLOCK();
        }
        piVar1 = (this->weight_data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            __ptr = (this->weight_data).data;
            pAVar2 = (this->weight_data).allocator;
            if (pAVar2 == (Allocator *)0x0) {
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
            }
            else {
              (*pAVar2->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data).data = local_140.data;
        (this->weight_data).refcount = local_140.refcount;
        (this->weight_data).elemsize = local_140.elemsize;
        (this->weight_data).elempack = local_140.elempack;
        (this->weight_data).allocator = local_140.allocator;
        (this->weight_data).dims = local_140.dims;
        (this->weight_data).w = local_140.w;
        (this->weight_data).h = local_140.h;
        (this->weight_data).d = local_140.d;
        (this->weight_data).c = local_140.c;
        (this->weight_data).cstep = local_140.cstep;
      }
      if (local_140.refcount != (int *)0x0) {
        LOCK();
        *local_140.refcount = *local_140.refcount + -1;
        UNLOCK();
        if (*local_140.refcount == 0) {
          if (local_140.allocator == (Allocator *)0x0) {
            if (local_140.data != (void *)0x0) {
              free(local_140.data);
            }
          }
          else {
            (*(local_140.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      bVar4 = true;
    }
    piVar1 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_f8.allocator == (Allocator *)0x0) {
          if (local_f8.data != (void *)0x0) {
            free(local_f8.data);
          }
        }
        else {
          (*(local_f8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (local_b0.refcount != (int *)0x0) {
      LOCK();
      *local_b0.refcount = *local_b0.refcount + -1;
      UNLOCK();
      if (*local_b0.refcount == 0) {
        if (local_b0.allocator == (Allocator *)0x0) {
          if (local_b0.data != (void *)0x0) {
            free(local_b0.data);
          }
        }
        else {
          (*(local_b0.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (!bVar4) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int Convolution::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

#if NCNN_INT8
    // runtime quantize the weight data
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)4u && int8_scale_term)
    {
        const int maxk = kernel_w * kernel_h;
        const int num_input = weight_data_size / num_output / maxk;

        Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

        Mat weight_data_int8;

        Option opt_q = opt;
        opt_q.blob_allocator = weight_data.allocator;
        opt_q.use_packing_layout = false;
        quantize_to_int8(weight_data_r2, weight_data_int8, weight_data_int8_scales, opt_q);
        if (weight_data_int8.empty())
            return -100;

        weight_data = weight_data_int8.reshape(weight_data_size);
    }
#else
    (void)(opt);
#endif // NCNN_INT8

    return 0;
}